

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TDeletingArray<SortNode_*,_SortNode_*>::~TDeletingArray
          (TDeletingArray<SortNode_*,_SortNode_*> *this)

{
  SortNode *pSVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = (this->super_TArray<SortNode_*,_SortNode_*>).Count;
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      pSVar1 = (this->super_TArray<SortNode_*,_SortNode_*>).Array[uVar3];
      if (pSVar1 != (SortNode *)0x0) {
        operator_delete(pSVar1,0x30);
        uVar2 = (this->super_TArray<SortNode_*,_SortNode_*>).Count;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < uVar2);
  }
  TArray<SortNode_*,_SortNode_*>::~TArray(&this->super_TArray<SortNode_*,_SortNode_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}